

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O0

void recursive_insert(lm_trie_t *trie,ngram_raw_t **raw_ngrams,uint32 *counts,int order)

{
  uint32 uVar1;
  undefined8 *puVar2;
  float32 fVar3;
  priority_queue_t *queue;
  uint *__dest;
  undefined4 *ptr;
  long *plVar4;
  void *ptr_00;
  undefined8 *element;
  size_t sVar5;
  ulong uVar6;
  long *plVar7;
  float prob;
  bitarr_address_t bVar8;
  bitarr_address_t address_00;
  bitarr_address_t address_01;
  bitarr_address_t address_02;
  bitarr_address_t address_2;
  middle_t *middle_1;
  bitarr_address_t address_1;
  float calc_prob;
  bitarr_address_t address;
  middle_t *middle;
  int j;
  ngram_raw_t *top;
  ngram_raw_t *tmp_ngram;
  int i;
  uint32 *raw_ngrams_ptr;
  ngram_raw_t *ngram;
  priority_queue_t *ngrams;
  uint32 unigram_count;
  float *probs;
  uint32 *words;
  uint32 unigram_idx;
  int order_local;
  uint32 *counts_local;
  ngram_raw_t **raw_ngrams_local;
  lm_trie_t *trie_local;
  
  words._0_4_ = 0;
  uVar1 = *counts;
  words._4_4_ = order;
  _unigram_idx = counts;
  counts_local = (uint32 *)raw_ngrams;
  raw_ngrams_local = (ngram_raw_t **)trie;
  queue = priority_queue_create((long)order,ngram_ord_comparator);
  __dest = (uint *)__ckd_calloc__((long)words._4_4_,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                  ,0x107);
  ptr = (undefined4 *)
        __ckd_calloc__((long)(words._4_4_ + -1),4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                       ,0x108);
  plVar4 = (long *)__ckd_calloc__(1,0x18,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                                  ,0x109);
  *(undefined4 *)(plVar4 + 2) = 1;
  *plVar4 = (long)&words;
  priority_queue_add(queue,plVar4);
  ptr_00 = __ckd_calloc__((long)(words._4_4_ + -1),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x10e);
  for (tmp_ngram._4_4_ = 2; (int)tmp_ngram._4_4_ <= words._4_4_;
      tmp_ngram._4_4_ = tmp_ngram._4_4_ + 1) {
    if (_unigram_idx[(int)(tmp_ngram._4_4_ + -1)] != 0) {
      *(undefined4 *)((long)ptr_00 + (long)(int)(tmp_ngram._4_4_ + -2) * 4) = 0;
      element = (undefined8 *)
                __ckd_calloc__(1,0x18,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                               ,0x117);
      puVar2 = *(undefined8 **)(counts_local + (long)(int)(tmp_ngram._4_4_ + -2) * 2);
      *element = *puVar2;
      element[1] = puVar2[1];
      element[2] = puVar2[2];
      *(uint *)(element + 2) = tmp_ngram._4_4_;
      priority_queue_add(queue,element);
    }
  }
  while( true ) {
    while (plVar4 = (long *)priority_queue_poll(queue), (int)plVar4[2] != 1) {
      for (tmp_ngram._4_4_ = 0; tmp_ngram._4_4_ < (int)plVar4[2] - 1U;
          tmp_ngram._4_4_ = tmp_ngram._4_4_ + 1) {
        if (__dest[(int)tmp_ngram._4_4_] != *(uint *)(*plVar4 + (long)(int)tmp_ngram._4_4_ * 4)) {
          if ((int)tmp_ngram._4_4_ < 1) {
            __assert_fail("i > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                          ,0x131,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)"
                         );
          }
          for (middle._4_4_ = tmp_ngram._4_4_; middle._4_4_ < (int)plVar4[2] - 1U;
              middle._4_4_ = middle._4_4_ + 1) {
            bVar8 = middle_insert((middle_t *)
                                  (raw_ngrams_local[3] + (long)(int)(middle._4_4_ - 1) * 2),
                                  *(uint32 *)(*plVar4 + (long)(int)middle._4_4_ * 4),
                                  middle._4_4_ + 1,words._4_4_);
            prob = (float)ptr[(int)(middle._4_4_ - 1)] +
                   *(float *)((long)&raw_ngrams_local[2]->words +
                             (ulong)*(uint *)(*plVar4 + (long)(int)middle._4_4_ * 4) * 0xc + 4);
            ptr[(int)middle._4_4_] = prob;
            address_00._12_4_ = 0;
            address_00.base = (void *)SUB128(bVar8._0_12_,0);
            address_00.offset = SUB124(bVar8._0_12_,8);
            lm_trie_quant_mwrite
                      ((lm_trie_quant_t *)raw_ngrams_local[6],address_00,middle._4_4_ - 1,
                       (float32)prob,0.0);
          }
        }
      }
      memcpy(__dest,(void *)*plVar4,(ulong)*(uint *)(plVar4 + 2) << 2);
      if ((int)plVar4[2] == words._4_4_) {
        bVar8 = longest_insert((longest_t *)raw_ngrams_local[5],
                               *(uint32 *)(*plVar4 + (ulong)((int)plVar4[2] - 1) * 4));
        address_01._12_4_ = 0;
        address_01.base = (void *)SUB128(bVar8._0_12_,0);
        address_01.offset = SUB124(bVar8._0_12_,8);
        lm_trie_quant_lwrite
                  ((lm_trie_quant_t *)raw_ngrams_local[6],address_01,*(float32 *)(plVar4 + 1));
      }
      else {
        bVar8 = middle_insert((middle_t *)(raw_ngrams_local[3] + (ulong)((int)plVar4[2] - 2) * 2),
                              *(uint32 *)(*plVar4 + (ulong)((int)plVar4[2] - 1) * 4),(int)plVar4[2],
                              words._4_4_);
        ptr[(int)plVar4[2] - 1] = (int)plVar4[1];
        address_02._12_4_ = 0;
        address_02.base = (void *)SUB128(bVar8._0_12_,0);
        address_02.offset = SUB124(bVar8._0_12_,8);
        lm_trie_quant_mwrite
                  ((lm_trie_quant_t *)raw_ngrams_local[6],address_02,(int)plVar4[2] + -2,
                   *(float32 *)(plVar4 + 1),*(float32 *)((long)plVar4 + 0xc));
      }
      uVar6 = (ulong)((int)plVar4[2] - 2);
      *(int *)((long)ptr_00 + uVar6 * 4) = *(int *)((long)ptr_00 + uVar6 * 4) + 1;
      if (*(uint *)((long)ptr_00 + (ulong)((int)plVar4[2] - 2) * 4) <
          _unigram_idx[(int)plVar4[2] - 1]) {
        plVar7 = (long *)(*(long *)(counts_local + (ulong)((int)plVar4[2] - 2) * 2) +
                         (ulong)*(uint *)((long)ptr_00 + (ulong)((int)plVar4[2] - 2) * 4) * 0x18);
        *plVar4 = *plVar7;
        plVar4[1] = plVar7[1];
        plVar4[2] = plVar7[2];
        priority_queue_add(queue,plVar4);
      }
      else {
        ckd_free(plVar4);
      }
    }
    fVar3 = (float32)unigram_next((lm_trie_t *)raw_ngrams_local,words._4_4_);
    (&raw_ngrams_local[2]->prob)[(ulong)(uint)words * 3] = fVar3;
    *__dest = (uint)words;
    *ptr = *(undefined4 *)((long)&raw_ngrams_local[2]->words + (ulong)(uint)words * 0xc);
    words._0_4_ = (uint)words + 1;
    if ((uint)words == uVar1 + 1) break;
    priority_queue_add(queue,plVar4);
  }
  ckd_free(plVar4);
  sVar5 = priority_queue_size(queue);
  if (sVar5 != 0) {
    __assert_fail("priority_queue_size(ngrams) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie.c"
                  ,0x160,"void recursive_insert(lm_trie_t *, ngram_raw_t **, uint32 *, int)");
  }
  priority_queue_free(queue,(_func_void_void_ptr *)0x0);
  ckd_free(ptr_00);
  ckd_free(__dest);
  ckd_free(ptr);
  return;
}

Assistant:

static void
recursive_insert(lm_trie_t * trie, ngram_raw_t ** raw_ngrams,
                 uint32 * counts, int order)
{
    uint32 unigram_idx = 0;
    uint32 *words;
    float *probs;
    const uint32 unigram_count = (uint32) counts[0];
    priority_queue_t *ngrams =
        priority_queue_create(order, &ngram_ord_comparator);
    ngram_raw_t *ngram;
    uint32 *raw_ngrams_ptr;
    int i;

    words = (uint32 *) ckd_calloc(order, sizeof(*words));
    probs = (float *) ckd_calloc(order - 1, sizeof(*probs));
    ngram = (ngram_raw_t *) ckd_calloc(1, sizeof(*ngram));
    ngram->order = 1;
    ngram->words = &unigram_idx;
    priority_queue_add(ngrams, ngram);
    raw_ngrams_ptr =
        (uint32 *) ckd_calloc(order - 1, sizeof(*raw_ngrams_ptr));
    for (i = 2; i <= order; ++i) {
        ngram_raw_t *tmp_ngram;
        
        if (counts[i - 1] <= 0)
            continue;

        raw_ngrams_ptr[i - 2] = 0;
        tmp_ngram =
            (ngram_raw_t *) ckd_calloc(1, sizeof(*tmp_ngram));
        *tmp_ngram = raw_ngrams[i - 2][0];
        tmp_ngram->order = i;

        priority_queue_add(ngrams, tmp_ngram);
    }

    for (;;) {
        ngram_raw_t *top =
            (ngram_raw_t *) priority_queue_poll(ngrams);

        if (top->order == 1) {
            trie->unigrams[unigram_idx].next = unigram_next(trie, order);
            words[0] = unigram_idx;
            probs[0] = trie->unigrams[unigram_idx].prob;
            if (++unigram_idx == unigram_count + 1) {
                ckd_free(top);
                break;
            }
            priority_queue_add(ngrams, top);
        }
        else {
            for (i = 0; (uint32)i < top->order - 1; i++) {
                if (words[i] != top->words[i]) {
                    /* need to insert dummy suffixes to make ngram of higher order reachable */
                    int j;
                    assert(i > 0);  /* unigrams are not pruned without removing ngrams that contains them */
                    for (j = i; (uint32)j < top->order - 1; j++) {
                        middle_t *middle = &trie->middle_begin[j - 1];
                        bitarr_address_t address =
                            middle_insert(middle, top->words[j],
                                          j + 1, order);
                        /* calculate prob for blank */
                        float calc_prob =
                            probs[j - 1] +
                            trie->unigrams[top->words[j]].bo;
                        probs[j] = calc_prob;
                        lm_trie_quant_mwrite(trie->quant, address, j - 1,
                                             calc_prob, 0.0f);
                    }
                }
            }
            memcpy(words, top->words,
                   top->order * sizeof(*words));
            if (top->order == (uint32)order) {
                bitarr_address_t address =
                    longest_insert(trie->longest,
                                   top->words[top->order - 1]);
                lm_trie_quant_lwrite(trie->quant, address, top->prob);
            }
            else {
                middle_t *middle = &trie->middle_begin[top->order - 2];
                bitarr_address_t address =
                    middle_insert(middle,
                                  top->words[top->order - 1],
                                  top->order, order);
                /* write prob and backoff */
                probs[top->order - 1] = top->prob;
                lm_trie_quant_mwrite(trie->quant, address, top->order - 2,
                                     top->prob, top->backoff);
            }
            raw_ngrams_ptr[top->order - 2]++;
            if (raw_ngrams_ptr[top->order - 2] < counts[top->order - 1]) {
        	*top = raw_ngrams[top->order -
                               2][raw_ngrams_ptr[top->order - 2]];

                priority_queue_add(ngrams, top);
            }
            else {
                ckd_free(top);
            }
        }
    }
    assert(priority_queue_size(ngrams) == 0);
    priority_queue_free(ngrams, NULL);
    ckd_free(raw_ngrams_ptr);
    ckd_free(words);
    ckd_free(probs);
}